

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

SUNErrCode SUNLinSolSpace_SPGMR(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  int iVar1;
  long lVar2;
  sunindextype lrw1;
  sunindextype liw1;
  long local_28;
  long local_20;
  
  iVar1 = *S->content;
  lVar2 = *(long *)((long)S->content + 0x88);
  if (*(long *)(*(long *)(lVar2 + 8) + 0x20) == 0) {
    local_20 = 0;
    local_28 = 0;
  }
  else {
    N_VSpace(lVar2,&local_28,&local_20);
  }
  lVar2 = (long)iVar1 + 5;
  *lenrwLS = local_28 * lVar2 + (long)((int)lVar2 * iVar1) + 2;
  *leniwLS = lVar2 * local_20;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSpace_SPGMR(SUNLinearSolver S, long int* lenrwLS,
                                long int* leniwLS)
{
  SUNFunctionBegin(S->sunctx);
  int maxl;
  sunindextype liw1, lrw1;
  maxl = SPGMR_CONTENT(S)->maxl;
  if (SPGMR_CONTENT(S)->vtemp->ops->nvspace)
  {
    N_VSpace(SPGMR_CONTENT(S)->vtemp, &lrw1, &liw1);
    SUNCheckLastErr();
  }
  else { lrw1 = liw1 = 0; }
  *lenrwLS = lrw1 * (maxl + 5) + maxl * (maxl + 5) + 2;
  *leniwLS = liw1 * (maxl + 5);
  return SUN_SUCCESS;
}